

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall
CDirectiveAlignFill::CDirectiveAlignFill(CDirectiveAlignFill *this,int64_t value,Mode mode)

{
  Mode mode_local;
  int64_t value_local;
  CDirectiveAlignFill *this_local;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectiveAlignFill_002aa0f8;
  Expression::Expression(&this->valueExpression);
  Expression::Expression(&this->fillExpression);
  *(Mode *)&(this->super_CAssemblerCommand).field_0x14 = mode;
  this->value = value;
  this->finalSize = 0;
  this->fillByte = '\0';
  return;
}

Assistant:

CDirectiveAlignFill::CDirectiveAlignFill(int64_t value, Mode mode)
{
	this->mode = mode;
	this->value = value;
	this->finalSize = 0;
	this->fillByte = 0;
}